

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O1

SparseArray * SparseArrayCopy(SparseArray *sarray)

{
  SparseArray *pSVar1;
  uint i;
  SparseArray *__dest;
  long lVar2;
  
  __dest = (SparseArray *)calloc(0x808,1);
  memcpy(__dest,sarray,0x808);
  __dest->refCount = 1;
  if (sarray->shift != 0) {
    lVar2 = 0;
    do {
      pSVar1 = (SparseArray *)__dest->data[lVar2];
      if ((((pSVar1 != &EmptyArray24) && (pSVar1 != &EmptyArray16)) && (pSVar1 != &EmptyArray)) &&
         (pSVar1 != &EmptyArray8)) {
        LOCK();
        pSVar1->refCount = pSVar1->refCount + 1;
        UNLOCK();
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
  }
  return __dest;
}

Assistant:

PRIVATE SparseArray *SparseArrayCopy(SparseArray * sarray)
{
	SparseArray *copy = calloc(sizeof(SparseArray), 1);
	memcpy(copy, sarray, sizeof(SparseArray));
	copy->refCount = 1;
	// If the sarray has children, increase their refcounts and link them
	if (sarray->shift > 0)
	{
		for (unsigned int i = 0 ; i<=MAX_INDEX(sarray); i++)
		{
			SparseArray *child = copy->data[i];
			if (!(child == &EmptyArray ||
			    child == &EmptyArray8 ||
			    child == &EmptyArray16 ||
			    child == &EmptyArray24))
			{
				__sync_fetch_and_add(&child->refCount, 1);
			}
			// Non-lazy copy.  Uncomment if debugging 
			// copy->data[i] = SparseArrayCopy(copy->data[i]);
		}
	}
	return copy;
}